

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::OP_Memset
               (Var instance,int32 start,Var value,int32 length,ScriptContext *scriptContext)

{
  DisableImplicitFlags DVar1;
  ImplicitCallFlags IVar2;
  Type TVar3;
  ThreadContext *pTVar4;
  long lVar5;
  ThreadContext *pTVar6;
  code *pcVar7;
  int iVar8;
  anon_class_24_3_7ffb91a5 fn;
  anon_class_24_3_7ffb91a5 fn_00;
  anon_class_24_3_7ffb91a5 fn_01;
  anon_class_24_3_7ffb91a5 fn_02;
  anon_class_24_3_7ffb91a5 fn_03;
  anon_class_24_3_7ffb91a5 fn_04;
  anon_class_24_3_7ffb91a5 fn_05;
  anon_class_24_3_7ffb91a5 fn_06;
  long *aValue;
  short sVar9;
  uint6 uVar10;
  bool bVar11;
  byte bVar12;
  ImplicitCallFlags IVar13;
  BOOL BVar14;
  uint uVar15;
  undefined4 *puVar16;
  RecyclableObject *this;
  JavascriptArray *pJVar17;
  TypedArray<float,_false,_false> *this_00;
  TypedArray<unsigned_char,_true,_false> *obj;
  TypedArray<double,_false,_false> *this_01;
  TypedArray<short,_false,_false> *obj_00;
  TypedArray<unsigned_short,_false,_false> *obj_01;
  TypedArray<unsigned_char,_false,_false> *obj_02;
  TypedArray<unsigned_int,_false,_false> *this_02;
  TypedArray<int,_false,_false> *this_03;
  uint uVar18;
  uint uVar19;
  size_t byteSize;
  size_t __n;
  ulong uVar20;
  Type puVar21;
  uint32 startIndex;
  uint uVar22;
  Var index;
  Var pvVar23;
  Var local_80;
  ScriptContext *local_78;
  undefined8 *local_70;
  long *local_68;
  undefined8 uStack_60;
  int32 intValue;
  ScriptContext **local_50;
  undefined8 local_48;
  TypedArrayType_conflict5 typedValue;
  bool local_35;
  uint local_34;
  
  __n = (size_t)(uint)length;
  pTVar4 = scriptContext->threadContext;
  local_35 = pTVar4->noJsReentrancy;
  pTVar4->noJsReentrancy = true;
  local_34 = 0;
  if (length < 1) goto LAB_00ab161e;
  pvVar23 = (Var)(ulong)(uint)start;
  _typedValue = value;
  if (instance != (Var)0x0) {
    if (((ulong)instance & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)instance & 0xffff000000000000) != 0x1000000000000) {
      local_68 = (long *)instance;
      if ((ulong)instance >> 0x32 == 0 && ((ulong)instance & 0xffff000000000000) != 0x1000000000000)
      goto LAB_00ab1640;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00ab1f07;
      *puVar16 = 0;
    }
switchD_00ab172f_caseD_1f:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                 ,0x14aa,"(false)","We don\'t support this type for memset yet.");
    if (!bVar11) {
LAB_00ab1f07:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar16 = 0;
    goto LAB_00ab161e;
  }
  AssertCount = AssertCount + 1;
  local_68 = (long *)instance;
  Throw::LogAssert();
  puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar16 = 1;
  bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                               ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
  if (!bVar11) goto LAB_00ab1f07;
  *puVar16 = 0;
LAB_00ab1640:
  this = UnsafeVarTo<Js::RecyclableObject>(local_68);
  if (this == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                 ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar11) goto LAB_00ab1f07;
    *puVar16 = 0;
  }
  TVar3 = ((this->type).ptr)->typeId;
  if ((0x57 < (int)TVar3) && (BVar14 = RecyclableObject::IsExternal(this), BVar14 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                 ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                 "GetTypeId aValue has invalid TypeId");
    if (!bVar11) goto LAB_00ab1f07;
    *puVar16 = 0;
  }
  uVar15 = local_48._4_4_;
  uVar10 = local_48._2_6_;
  switch(TVar3) {
  case TypeIds_Array:
  case TypeIds_NativeIntArray:
  case TypeIds_ArrayLast:
    if (start < 0) {
      index = (Var)((ulong)(uint)start | 0x1000000000000);
      do {
        BVar14 = OP_SetElementI(local_68,index,_typedValue,scriptContext,PropertyOperation_None);
        if (BVar14 == 0) {
          local_34 = 0;
          goto LAB_00ab161e;
        }
        iVar8 = (int)__n;
        length = iVar8 - 1;
        pvVar23 = (Var)((long)index + 1);
      } while (((int)index < -1) && (__n = (size_t)(uint)length, index = pvVar23, 1 < iVar8));
    }
    bVar11 = ScriptContextOptimizationOverrideInfo::IsEnabledArraySetElementFastPath
                       (&scriptContext->optimizationOverrides);
    aValue = local_68;
    if (bVar11) {
      lVar5 = *local_68;
      startIndex = (uint32)pvVar23;
      if (TVar3 == TypeIds_NativeIntArray) {
        bVar11 = TaggedInt::Is(_typedValue);
        if (!bVar11) break;
        uStack_60 = (undefined8 **)((ulong)uStack_60._4_4_ << 0x20);
        bVar11 = MemsetConversion<int,_&Js::JavascriptConversion::ToInt32>
                           (_typedValue,scriptContext,(int *)&uStack_60);
        if (!bVar11 || (int)uStack_60 == -0x7fffe) break;
        pJVar17 = UnsafeVarTo<Js::JavascriptArray>(aValue);
        bVar11 = JavascriptArray::DirectSetItemAtRange<int>
                           (pJVar17,startIndex,length,(int)uStack_60);
      }
      else if (TVar3 == TypeIds_Array) {
        pJVar17 = UnsafeVarTo<Js::JavascriptArray>(local_68);
        bVar11 = JavascriptArray::DirectSetItemAtRange<void*>(pJVar17,startIndex,length,_typedValue)
        ;
      }
      else {
        if (((ulong)_typedValue >> 0x32 == 0) &&
           (bVar11 = VarIs<Js::RecyclableObject>(_typedValue), bVar11)) break;
        uStack_60 = (undefined8 **)0x0;
        bVar11 = MemsetConversion<double,_&Js::JavascriptConversion::ToNumber>
                           (_typedValue,scriptContext,(double *)&uStack_60);
        if (!bVar11 || uStack_60 == (undefined8 **)&DAT_fff80002fff80002) break;
        pJVar17 = UnsafeVarTo<Js::JavascriptArray>(aValue);
        bVar11 = JavascriptArray::DirectSetItemAtRange<double>
                           (pJVar17,startIndex,length,(double)uStack_60);
      }
      local_34 = (uint)(byte)(lVar5 == *aValue & bVar11);
    }
    break;
  default:
    goto switchD_00ab172f_caseD_1f;
  case TypeIds_Int8Array:
    local_70 = &local_48;
    local_48 = (double)((ulong)local_48._1_7_ << 8);
    _intValue = &local_80;
    local_80 = _typedValue;
    local_50 = &local_78;
    uStack_60 = &local_70;
    fn_03.value = _intValue;
    fn_03.result = (char **)uStack_60;
    fn_03.scriptContext = local_50;
    local_78 = scriptContext;
    IVar13 = ThreadContext::
             TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                       (scriptContext->threadContext,fn_03);
    if (ImplicitCall_None < IVar13) break;
    obj_02 = (TypedArray<unsigned_char,_false,_false> *)
             VarTo<Js::TypedArray<char,false,false>>(local_68);
    bVar12 = (byte)local_48;
    BVar14 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<char,false,false>>
                       ((TypedArray<char,_false,_false> *)obj_02);
    local_34 = 0;
    if (BVar14 != 0) break;
    if (((((TypedArray<char,_false,_false> *)obj_02)->super_TypedArrayBase).super_ArrayBufferParent.
         arrayBuffer.ptr)->isDetached == true) {
      JavascriptError::ThrowTypeError
                ((((((((TypedArray<char,_false,_false> *)obj_02)->super_TypedArrayBase).
                     super_ArrayBufferParent.super_ArrayObject.super_DynamicObject.
                     super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    if (start < 0) {
      if ((long)((long)start + __n) < 0) goto LAB_00ab1ee8;
      __n = (size_t)(uint)(length + start);
      pvVar23 = (Var)0x0;
    }
    uVar15 = (((TypedArray<char,_false,_false> *)obj_02)->super_TypedArrayBase).
             super_ArrayBufferParent.super_ArrayObject.length;
    local_34 = 1;
    uVar22 = (uint)pvVar23;
    uVar18 = uVar15 - uVar22;
    if (uVar15 < uVar22 || uVar18 == 0) break;
    uVar19 = uVar22 + (uint)__n;
    if (CARRY4(uVar22,(uint)__n)) {
      ::Math::DefaultOverflowPolicy();
    }
    goto LAB_00ab1d05;
  case TypeIds_Uint8Array:
    local_70 = &local_48;
    local_48 = (double)((ulong)local_48._1_7_ << 8);
    _intValue = &local_80;
    local_80 = _typedValue;
    local_50 = &local_78;
    uStack_60 = &local_70;
    fn_04.value = _intValue;
    fn_04.result = (uchar **)uStack_60;
    fn_04.scriptContext = local_50;
    local_78 = scriptContext;
    IVar13 = ThreadContext::
             TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                       (scriptContext->threadContext,fn_04);
    if (ImplicitCall_None < IVar13) break;
    obj_02 = VarTo<Js::TypedArray<unsigned_char,false,false>>(local_68);
    bVar12 = (byte)local_48;
    BVar14 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<unsigned_char,false,false>>(obj_02);
    local_34 = 0;
    if (BVar14 != 0) break;
    if (((obj_02->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == true
       ) {
      JavascriptError::ThrowTypeError
                ((((((obj_02->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    if (start < 0) {
      if ((long)((long)start + __n) < 0) goto LAB_00ab1ee8;
      __n = (size_t)(uint)(length + start);
      pvVar23 = (Var)0x0;
    }
    uVar15 = (obj_02->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
    local_34 = 1;
    uVar22 = (uint)pvVar23;
    uVar18 = uVar15 - uVar22;
    if (uVar15 < uVar22 || uVar18 == 0) break;
    uVar19 = uVar22 + (uint)__n;
    if (CARRY4(uVar22,(uint)__n)) {
      ::Math::DefaultOverflowPolicy();
    }
LAB_00ab1d05:
    if (uVar15 < uVar19) {
      __n = (size_t)uVar18;
    }
    puVar21 = (Type)((long)pvVar23 +
                    (long)(((TypedArray<char,_false,_false> *)obj_02)->super_TypedArrayBase).buffer)
    ;
LAB_00ab1d15:
    uVar15 = (uint)bVar12;
LAB_00ab1d18:
    local_34 = 1;
    memset(puVar21,uVar15,__n);
    break;
  case TypeIds_Uint8ClampedArray:
    pTVar6 = scriptContext->threadContext;
    DVar1 = pTVar6->disableImplicitFlags;
    IVar13 = pTVar6->implicitCallFlags;
    pTVar6->disableImplicitFlags = DVar1 | DisableImplicitCallFlag;
    pTVar6->implicitCallFlags = ImplicitCall_None;
    bVar12 = JavascriptConversion::ToUInt8Clamped(_typedValue,scriptContext);
    IVar2 = pTVar6->implicitCallFlags;
    pTVar6->disableImplicitFlags = DVar1;
    pTVar6->implicitCallFlags = IVar13;
    if (ImplicitCall_None < IVar2) break;
    obj = VarTo<Js::TypedArray<unsigned_char,true,false>>(local_68);
    BVar14 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<unsigned_char,true,false>>(obj);
    if (BVar14 != 0) break;
    if (((obj->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == true) {
      JavascriptError::ThrowTypeError
                ((((((obj->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    if (start < 0) {
      if ((long)((long)start + __n) < 0) goto LAB_00ab1ee8;
      length = length + start;
      start = 0;
    }
    uVar15 = (obj->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
    local_34 = 1;
    if (uVar15 < (uint)start || uVar15 - start == 0) break;
    if (CARRY4(start,length)) {
      ::Math::DefaultOverflowPolicy();
    }
    if (uVar15 < (uint)(start + length)) {
      length = uVar15 - start;
    }
    __n = (size_t)(uint)length;
    puVar21 = (obj->super_TypedArrayBase).buffer + (uint)start;
    goto LAB_00ab1d15;
  case TypeIds_Int16Array:
    local_70 = &local_48;
    local_48 = (double)((ulong)uVar10 << 0x10);
    _intValue = &local_80;
    local_80 = _typedValue;
    local_50 = &local_78;
    uStack_60 = &local_70;
    fn_01.value = _intValue;
    fn_01.result = (short **)uStack_60;
    fn_01.scriptContext = local_50;
    local_78 = scriptContext;
    IVar13 = ThreadContext::
             TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                       (scriptContext->threadContext,fn_01);
    if (ImplicitCall_None < IVar13) break;
    obj_00 = VarTo<Js::TypedArray<short,false,false>>(local_68);
    sVar9 = (short)local_48;
    BVar14 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<short,false,false>>(obj_00);
    local_34 = 0;
    if (BVar14 != 0) break;
    if (((obj_00->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == true
       ) {
      JavascriptError::ThrowTypeError
                ((((((obj_00->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    if (start < 0) {
      if ((long)((long)start + __n) < 0) goto LAB_00ab1ee8;
      length = length + start;
      pvVar23 = (Var)0x0;
    }
    uVar15 = (obj_00->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
    local_34 = 1;
    uVar18 = (uint)pvVar23;
    if (uVar15 < uVar18 || uVar15 - uVar18 == 0) break;
    if (CARRY4(uVar18,length)) {
      ::Math::DefaultOverflowPolicy();
    }
    if (uVar15 < uVar18 + length) {
      length = uVar15 - uVar18;
    }
    uVar20 = (ulong)(uint)length;
    puVar21 = (obj_00->super_TypedArrayBase).buffer;
    if (sVar9 != 0) {
      if (length == 0) break;
      do {
        *(short *)(puVar21 + (long)pvVar23 * 2) = sVar9;
        pvVar23 = (Var)(ulong)((int)pvVar23 + 1);
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
      goto LAB_00ab1ee8;
    }
LAB_00ab1ef4:
    __n = uVar20 * 2;
    puVar21 = puVar21 + (long)pvVar23 * 2;
    uVar15 = 0;
    goto LAB_00ab1d18;
  case TypeIds_Uint16Array:
    local_70 = &local_48;
    local_48 = (double)((ulong)uVar10 << 0x10);
    _intValue = &local_80;
    local_80 = _typedValue;
    local_50 = &local_78;
    uStack_60 = &local_70;
    fn_02.value = _intValue;
    fn_02.result = (unsigned_short **)uStack_60;
    fn_02.scriptContext = local_50;
    local_78 = scriptContext;
    IVar13 = ThreadContext::
             TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                       (scriptContext->threadContext,fn_02);
    if (ImplicitCall_None < IVar13) break;
    obj_01 = VarTo<Js::TypedArray<unsigned_short,false,false>>(local_68);
    sVar9 = (short)local_48;
    BVar14 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<unsigned_short,false,false>>(obj_01);
    local_34 = 0;
    if (BVar14 != 0) break;
    if (((obj_01->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == true
       ) {
      JavascriptError::ThrowTypeError
                ((((((obj_01->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    if (start < 0) {
      if ((long)((long)start + __n) < 0) goto LAB_00ab1ee8;
      length = length + start;
      pvVar23 = (Var)0x0;
    }
    uVar15 = (obj_01->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
    local_34 = 1;
    uVar18 = (uint)pvVar23;
    if (uVar15 < uVar18 || uVar15 - uVar18 == 0) break;
    if (CARRY4(uVar18,length)) {
      ::Math::DefaultOverflowPolicy();
    }
    if (uVar15 < uVar18 + length) {
      length = uVar15 - uVar18;
    }
    uVar20 = (ulong)(uint)length;
    puVar21 = (obj_01->super_TypedArrayBase).buffer;
    if (sVar9 == 0) goto LAB_00ab1ef4;
    if (length == 0) break;
    do {
      *(short *)(puVar21 + (long)pvVar23 * 2) = sVar9;
      pvVar23 = (Var)(ulong)((int)pvVar23 + 1);
      uVar20 = uVar20 - 1;
    } while (uVar20 != 0);
LAB_00ab1ee8:
    local_34 = 1;
    break;
  case TypeIds_Int32Array:
    local_70 = &local_48;
    local_48 = (double)((ulong)uVar15 << 0x20);
    _intValue = &local_80;
    local_80 = _typedValue;
    local_50 = &local_78;
    uStack_60 = &local_70;
    fn_06.value = _intValue;
    fn_06.result = (int **)uStack_60;
    fn_06.scriptContext = local_50;
    local_78 = scriptContext;
    IVar13 = ThreadContext::
             TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                       (scriptContext->threadContext,fn_06);
    if (IVar13 < 2) {
      this_03 = VarTo<Js::TypedArray<int,false,false>>(local_68);
      local_34 = TypedArray<int,_false,_false>::DirectSetItemAtRange
                           (this_03,start,length,(int)(float)local_48);
    }
    break;
  case TypeIds_Uint32Array:
    local_70 = &local_48;
    local_48 = (double)((ulong)uVar15 << 0x20);
    _intValue = &local_80;
    local_80 = _typedValue;
    local_50 = &local_78;
    uStack_60 = &local_70;
    fn_05.value = _intValue;
    fn_05.result = (uint **)uStack_60;
    fn_05.scriptContext = local_50;
    local_78 = scriptContext;
    IVar13 = ThreadContext::
             TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                       (scriptContext->threadContext,fn_05);
    if (IVar13 < 2) {
      this_02 = VarTo<Js::TypedArray<unsigned_int,false,false>>(local_68);
      local_34 = TypedArray<unsigned_int,_false,_false>::DirectSetItemAtRange
                           (this_02,start,length,(uint)(float)local_48);
    }
    break;
  case TypeIds_Float32Array:
    local_70 = &local_48;
    local_48 = (double)((ulong)uVar15 << 0x20);
    _intValue = &local_80;
    local_80 = _typedValue;
    local_50 = &local_78;
    uStack_60 = &local_70;
    fn.value = _intValue;
    fn.result = (float **)uStack_60;
    fn.scriptContext = local_50;
    local_78 = scriptContext;
    IVar13 = ThreadContext::
             TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                       (scriptContext->threadContext,fn);
    if (IVar13 < 2) {
      this_00 = VarTo<Js::TypedArray<float,false,false>>(local_68);
      local_34 = TypedArray<float,_false,_false>::DirectSetItemAtRange
                           (this_00,start,length,(float)local_48);
    }
    break;
  case TypeIds_Float64Array:
    local_70 = &local_48;
    local_48 = 0.0;
    _intValue = &local_80;
    local_80 = _typedValue;
    local_50 = &local_78;
    uStack_60 = &local_70;
    fn_00.value = _intValue;
    fn_00.result = (double **)uStack_60;
    fn_00.scriptContext = local_50;
    local_78 = scriptContext;
    IVar13 = ThreadContext::
             TryWithDisabledImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime_Language_JavascriptOperators_cpp:5187:98)>
                       (scriptContext->threadContext,fn_00);
    if (IVar13 < 2) {
      this_01 = VarTo<Js::TypedArray<double,false,false>>(local_68);
      local_34 = TypedArray<double,_false,_false>::DirectSetItemAtRange
                           (this_01,start,length,local_48);
    }
  }
LAB_00ab161e:
  pTVar4->noJsReentrancy = local_35;
  return local_34;
}

Assistant:

BOOL JavascriptOperators::OP_Memset(Var instance, int32 start, Var value, int32 length, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Op_Memset, reentrancylock, scriptContext->GetThreadContext());
        if (length <= 0)
        {
            return false;
        }

        TypeId instanceType = JavascriptOperators::GetTypeId(instance);
        BOOL  returnValue = false;

        // The typed array will deal with all possible values for the index
#define MEMSET_TYPED_ARRAY_CASE(type, conversion) \
        case TypeIds_##type: \
        { \
            type## ::TypedArrayType typedValue = 0; \
            if (!MemsetConversion<type## ::TypedArrayType, JavascriptConversion:: ##conversion>(value, scriptContext, &typedValue)) return false; \
            returnValue = VarTo< type## >(instance)->DirectSetItemAtRange(start, length, typedValue); \
            break; \
        }
        switch (instanceType)
        {
        MEMSET_TYPED_ARRAY_CASE(Int8Array, ToInt8)
        MEMSET_TYPED_ARRAY_CASE(Uint8Array, ToUInt8)
        MEMSET_TYPED_ARRAY_CASE(Uint8ClampedArray, ToUInt8Clamped)
        MEMSET_TYPED_ARRAY_CASE(Int16Array, ToInt16)
        MEMSET_TYPED_ARRAY_CASE(Uint16Array, ToUInt16)
        MEMSET_TYPED_ARRAY_CASE(Int32Array, ToInt32)
        MEMSET_TYPED_ARRAY_CASE(Uint32Array, ToUInt32)
        MEMSET_TYPED_ARRAY_CASE(Float32Array, ToFloat)
        MEMSET_TYPED_ARRAY_CASE(Float64Array, ToNumber)
        case TypeIds_NativeFloatArray:
        case TypeIds_NativeIntArray:
        case TypeIds_Array:
        {
            if (start < 0)
            {
                for (start; start < 0 && length > 0; ++start, --length)
                {
                    if (!OP_SetElementI(instance, JavascriptNumber::ToVar(start, scriptContext), value, scriptContext))
                    {
                        return false;
                    }
                }
            }
            if (scriptContext->optimizationOverrides.IsEnabledArraySetElementFastPath())
            {
                INT_PTR vt = VirtualTableInfoBase::GetVirtualTable(instance);
                if (instanceType == TypeIds_Array)
                {
                    returnValue = UnsafeVarTo<JavascriptArray>(instance)->DirectSetItemAtRange<Var>(start, length, value);
                }
                else if (instanceType == TypeIds_NativeIntArray)
                {
                    // Only accept tagged int.
                    if (!TaggedInt::Is(value))
                    {
                        return false;
                    }
                    int32 intValue = 0;
                    if (!MemsetConversion<int32, JavascriptConversion::ToInt32>(value, scriptContext, &intValue))
                    {
                        return false;
                    }
                     // Special case for missing item
                    if (SparseArraySegment<int32>::IsMissingItem(&intValue))
                    {
                        return false;
                    }
                    returnValue = UnsafeVarTo<JavascriptArray>(instance)->DirectSetItemAtRange<int32>(start, length, intValue);
                }
                else
                {
                    // For native float arrays, the jit doesn't check the type of the source so we have to do it here
                    if (!JavascriptNumber::Is(value) && !TaggedNumber::Is(value))
                    {
                        return false;
                    }

                    double doubleValue = 0;
                    if (!MemsetConversion<double, JavascriptConversion::ToNumber>(value, scriptContext, &doubleValue))
                    {
                        return false;
                    }
                    // Special case for missing item
                    if (SparseArraySegment<double>::IsMissingItem(&doubleValue))
                    {
                        return false;
                    }
                    returnValue = UnsafeVarTo<JavascriptArray>(instance)->DirectSetItemAtRange<double>(start, length, doubleValue);
                }
                returnValue &= vt == VirtualTableInfoBase::GetVirtualTable(instance);
            }
            break;
        }
        default:
            AssertMsg(false, "We don't support this type for memset yet.");
            break;
        }

#undef MEMSET_TYPED_ARRAY
        return returnValue;
        JIT_HELPER_END(Op_Memset);
    }